

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MappedPointerVector.hpp
# Opt level: O0

optional<unsigned_long> __thiscall
gmlc::containers::MappedPointerVector<helics::TranslatorInfo,_helics::GlobalHandle>::insert
          (MappedPointerVector<helics::TranslatorInfo,_helics::GlobalHandle> *this,
          GlobalHandle *searchValue,
          unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_> *ptr)

{
  bool bVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  vector<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>,_std::allocator<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>_>_>
  *in_RDI;
  optional<unsigned_long> oVar3;
  size_type index;
  iterator fnd;
  unordered_map<helics::GlobalHandle,_unsigned_long,_std::hash<helics::GlobalHandle>,_std::equal_to<helics::GlobalHandle>,_std::allocator<std::pair<const_helics::GlobalHandle,_unsigned_long>_>_>
  *in_stack_ffffffffffffff98;
  GlobalHandle *in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffb1;
  _Node_iterator_base<std::pair<const_helics::GlobalHandle,_unsigned_long>,_false> local_38;
  _Node_iterator_base<std::pair<const_helics::GlobalHandle,_unsigned_long>,_false> local_30 [4];
  _Storage<unsigned_long,_true> local_10;
  undefined1 local_8;
  
  local_30[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<helics::GlobalHandle,_unsigned_long,_std::hash<helics::GlobalHandle>,_std::equal_to<helics::GlobalHandle>,_std::allocator<std::pair<const_helics::GlobalHandle,_unsigned_long>_>_>
       ::find(in_stack_ffffffffffffff98,(key_type *)0x5badab);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<helics::GlobalHandle,_unsigned_long,_std::hash<helics::GlobalHandle>,_std::equal_to<helics::GlobalHandle>,_std::allocator<std::pair<const_helics::GlobalHandle,_unsigned_long>_>_>
       ::end(in_stack_ffffffffffffff98);
  bVar1 = std::__detail::operator==(local_30,&local_38);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::
    vector<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>,_std::allocator<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>_>_>
    ::size(in_RDI);
    std::
    vector<std::unique_ptr<helics::TranslatorInfo,std::default_delete<helics::TranslatorInfo>>,std::allocator<std::unique_ptr<helics::TranslatorInfo,std::default_delete<helics::TranslatorInfo>>>>
    ::
    emplace_back<std::unique_ptr<helics::TranslatorInfo,std::default_delete<helics::TranslatorInfo>>>
              ((vector<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>,_std::allocator<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>_>_>
                *)CONCAT71(in_stack_ffffffffffffffb1,in_stack_ffffffffffffffb0),
               (unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_> *)
               in_stack_ffffffffffffffa8);
    std::
    unordered_map<helics::GlobalHandle,unsigned_long,std::hash<helics::GlobalHandle>,std::equal_to<helics::GlobalHandle>,std::allocator<std::pair<helics::GlobalHandle_const,unsigned_long>>>
    ::emplace<helics::GlobalHandle_const&,unsigned_long&>
              ((unordered_map<helics::GlobalHandle,_unsigned_long,_std::hash<helics::GlobalHandle>,_std::equal_to<helics::GlobalHandle>,_std::allocator<std::pair<const_helics::GlobalHandle,_unsigned_long>_>_>
                *)CONCAT71(in_stack_ffffffffffffffb1,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffa8,(unsigned_long *)in_RDI);
    std::optional<unsigned_long>::optional<unsigned_long,_true>
              ((optional<unsigned_long> *)in_RDI,(unsigned_long *)in_stack_ffffffffffffff98);
    uVar2 = extraout_RDX_00;
  }
  else {
    std::optional<unsigned_long>::optional((optional<unsigned_long> *)&local_10);
    uVar2 = extraout_RDX;
  }
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_7_ = (undefined7)((ulong)uVar2 >> 8);
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = (bool)local_8;
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = local_10._M_value;
  return (optional<unsigned_long>)
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<size_t>
        insert(const searchType& searchValue, std::unique_ptr<VType>&& ptr)
    {
        auto fnd = lookup.find(searchValue);
        if (fnd != lookup.end()) {
            return std::nullopt;
        }
        auto index = dataStorage.size();
        dataStorage.emplace_back(std::move(ptr));
        lookup.emplace(searchValue, index);
        return index;
    }